

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers_iterator.hpp
# Opt level: O3

void __thiscall
asio::buffers_iterator<asio::const_buffers_1,_char>::advance
          (buffers_iterator<asio::const_buffers_1,_char> *this,ptrdiff_t n)

{
  buffer_sequence_iterator_type pcVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  buffer_sequence_iterator_type pcVar8;
  buffer_sequence_iterator_type pcVar9;
  
  if (0 < n) {
    sVar3 = this->current_buffer_position_;
    sVar6 = (this->current_buffer_).size_ - sVar3;
    if (n < (long)sVar6) {
      sVar4 = this->position_;
    }
    else {
      pcVar1 = this->end_;
      sVar4 = this->position_;
      sVar3 = 0;
      pcVar8 = this->current_;
      do {
        pcVar9 = pcVar8 + 1;
        sVar4 = sVar4 + sVar6;
        this->position_ = sVar4;
        this->current_ = pcVar9;
        if (pcVar9 == pcVar1) {
          (this->current_buffer_).data_ = (void *)0x0;
          (this->current_buffer_).size_ = 0;
          this->current_buffer_position_ = 0;
          return;
        }
        n = n - sVar6;
        sVar6 = pcVar8[1].size_;
        (this->current_buffer_).data_ = pcVar9->data_;
        (this->current_buffer_).size_ = sVar6;
        this->current_buffer_position_ = 0;
        sVar6 = (this->current_buffer_).size_;
        pcVar8 = pcVar9;
      } while ((long)sVar6 <= n);
    }
    this->position_ = sVar4 + n;
    this->current_buffer_position_ = sVar3 + n;
    return;
  }
  if (-1 < n) {
    return;
  }
  uVar7 = -n;
  uVar5 = this->current_buffer_position_;
  if (uVar5 < uVar7) {
    pcVar1 = this->begin_;
    pcVar8 = this->current_;
    sVar3 = this->position_;
    do {
      sVar3 = sVar3 - uVar5;
      this->position_ = sVar3;
      if (pcVar8 == pcVar1) {
        sVar3 = 0;
        goto LAB_00154018;
      }
      uVar7 = uVar7 - uVar5;
      pcVar9 = pcVar8;
      do {
        if (pcVar9 == pcVar1) goto LAB_00153fff;
        sVar6 = pcVar9[-1].size_;
        pcVar9 = pcVar9 + -1;
      } while (sVar6 == 0);
      pvVar2 = pcVar9->data_;
      this->current_ = pcVar9;
      (this->current_buffer_).data_ = pvVar2;
      (this->current_buffer_).size_ = sVar6;
      this->current_buffer_position_ = sVar6;
      pcVar8 = pcVar9;
      uVar5 = sVar6;
LAB_00153fff:
    } while (uVar5 < uVar7);
  }
  else {
    sVar3 = this->position_;
  }
  this->position_ = sVar3 - uVar7;
  sVar3 = uVar5 - uVar7;
LAB_00154018:
  this->current_buffer_position_ = sVar3;
  return;
}

Assistant:

void advance(std::ptrdiff_t n)
  {
    if (n > 0)
    {
      ASIO_ASSERT(current_ != end_ && "iterator out of bounds");
      for (;;)
      {
        std::ptrdiff_t current_buffer_balance
          = current_buffer_.size() - current_buffer_position_;

        // Check if the advance can be satisfied by the current buffer.
        if (current_buffer_balance > n)
        {
          position_ += n;
          current_buffer_position_ += n;
          return;
        }

        // Update position.
        n -= current_buffer_balance;
        position_ += current_buffer_balance;

        // Move to next buffer. If it is empty then it will be skipped on the
        // next iteration of this loop.
        if (++current_ == end_)
        {
          ASIO_ASSERT(n == 0 && "iterator out of bounds");
          current_buffer_ = buffer_type();
          current_buffer_position_ = 0;
          return;
        }
        current_buffer_ = *current_;
        current_buffer_position_ = 0;
      }
    }
    else if (n < 0)
    {
      std::size_t abs_n = -n;
      ASIO_ASSERT(position_ >= abs_n && "iterator out of bounds");
      for (;;)
      {
        // Check if the advance can be satisfied by the current buffer.
        if (current_buffer_position_ >= abs_n)
        {
          position_ -= abs_n;
          current_buffer_position_ -= abs_n;
          return;
        }

        // Update position.
        abs_n -= current_buffer_position_;
        position_ -= current_buffer_position_;

        // Check if we've reached the beginning of the buffers.
        if (current_ == begin_)
        {
          ASIO_ASSERT(abs_n == 0 && "iterator out of bounds");
          current_buffer_position_ = 0;
          return;
        }

        // Find the previous non-empty buffer.
        buffer_sequence_iterator_type iter = current_;
        while (iter != begin_)
        {
          --iter;
          buffer_type buffer = *iter;
          std::size_t buffer_size = buffer.size();
          if (buffer_size > 0)
          {
            current_ = iter;
            current_buffer_ = buffer;
            current_buffer_position_ = buffer_size;
            break;
          }
        }
      }
    }
  }